

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

QMenu * __thiscall
QWidgetTextControl::createStandardContextMenu(QWidgetTextControl *this,QPointF *pos,QWidget *parent)

{
  uint uVar1;
  long lVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  int *piVar6;
  bool bVar7;
  byte bVar8;
  char cVar9;
  QWidget *this_00;
  QAction *pQVar10;
  QUnicodeControlCharacterMenu *this_01;
  QKeySequence *pQVar11;
  long in_FS_OFFSET;
  QKeySequence local_2a0 [8];
  QArrayData *local_298;
  char16_t *pcStack_290;
  qsizetype local_288;
  QStringBuilder<char16_t,_QString> local_278;
  QKeySequence local_250 [8];
  QString local_248;
  QKeySequence local_230 [8];
  QArrayData *local_228;
  char16_t *pcStack_220;
  qsizetype local_218;
  QStringBuilder<char16_t,_QString> local_208;
  QKeySequence local_1e0 [8];
  QString local_1d8;
  QKeySequence local_1c0 [8];
  QArrayData *local_1b8;
  char16_t *pcStack_1b0;
  qsizetype local_1a8;
  QStringBuilder<char16_t,_QString> local_198;
  QKeySequence local_170 [8];
  QString local_168;
  QKeySequence local_150 [8];
  QArrayData *local_148;
  char16_t *pcStack_140;
  qsizetype local_138;
  QStringBuilder<char16_t,_QString> local_128;
  QKeySequence local_108 [8];
  QKeySequence local_100 [8];
  QArrayData *local_f8;
  char16_t *pcStack_f0;
  qsizetype local_e8;
  QStringBuilder<char16_t,_QString> local_d8;
  QKeySequence local_b8 [8];
  QKeySequence local_b0 [8];
  QArrayData *local_a8;
  char16_t *pcStack_a0;
  qsizetype local_98;
  QStringBuilder<char16_t,_QString> local_90;
  QKeySequence local_70 [8];
  QStringBuilder<QString,_QString> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  uVar1 = *(uint *)(lVar2 + 0xb0);
  pQVar3 = *(QArrayData **)(lVar2 + 0x198);
  *(undefined8 *)(lVar2 + 0x198) = 0;
  *(undefined8 *)(lVar2 + 0x1a0) = 0;
  *(undefined8 *)(lVar2 + 0x1a8) = 0;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if ((((pos->xp != 0.0) || (NAN(pos->xp))) || (pos->yp != 0.0)) || (NAN(pos->yp))) {
    (**(code **)(*(long *)this + 0x70))(&local_68,this,pos);
    pQVar3 = *(QArrayData **)(lVar2 + 0x198);
    pcVar4 = *(char16_t **)(lVar2 + 0x1a0);
    *(Data **)(lVar2 + 0x198) = local_68.a.d.d;
    *(char16_t **)(lVar2 + 0x1a0) = local_68.a.d.ptr;
    qVar5 = *(qsizetype *)(lVar2 + 0x1a8);
    *(qsizetype *)(lVar2 + 0x1a8) = local_68.a.d.size;
    local_68.a.d.d = (Data *)pQVar3;
    local_68.a.d.ptr = pcVar4;
    local_68.a.d.size = qVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
  }
  if (((uVar1 & 0x13) == 0) && (*(long *)(lVar2 + 0x1a8) == 0)) {
    this_00 = (QWidget *)0x0;
    goto LAB_004ce314;
  }
  this_00 = (QWidget *)operator_new(0x28);
  QMenu::QMenu((QMenu *)this_00,parent);
  if ((*(byte *)(lVar2 + 0xb0) & 0x10) != 0) {
    QMetaObject::tr((char *)&local_128,(char *)&staticMetaObject,0x6e7144);
    bVar8 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar8 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_70,Undo);
      cVar9 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar9 != '\0') goto LAB_004cce0f;
      QKeySequence::QKeySequence(local_b0,Undo);
      QKeySequence::toString((SequenceFormat)&local_a8);
      local_90.b.d.size = local_98;
      local_90.b.d.ptr = pcStack_a0;
      local_90.b.d.d = (Data *)local_a8;
      local_90.a = L'\t';
      local_a8 = (QArrayData *)0x0;
      pcStack_a0 = (char16_t *)0x0;
      local_98 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_198,&local_90);
      bVar8 = 1;
      bVar7 = true;
    }
    else {
LAB_004cce0f:
      bVar8 = bVar8 ^ 1;
      local_198._0_8_ = (QArrayData *)0x0;
      local_198.b.d.d = (Data *)0x0;
      local_198.b.d.ptr = (char16_t *)0x0;
      bVar7 = false;
    }
    local_68.a.d.size = (qsizetype)local_128.b.d.ptr;
    local_68.a.d.ptr = (char16_t *)local_128.b.d.d;
    local_68.a.d.d = (Data *)local_128._0_8_;
    local_68.b.d.size = (qsizetype)local_198.b.d.ptr;
    local_68.b.d.ptr = (char16_t *)local_198.b.d.d;
    local_68.b.d.d = (Data *)local_198._0_8_;
    local_128._0_8_ = (QArrayData *)0x0;
    local_128.b.d.d = (Data *)0x0;
    local_128.b.d.ptr = (char16_t *)0x0;
    local_198._0_8_ = (QArrayData *)0x0;
    local_198.b.d.d = (Data *)0x0;
    local_198.b.d.ptr = (char16_t *)0x0;
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_d8,&local_68);
    pQVar10 = QWidget::addAction(this_00,(QString *)&local_d8,(QObject *)this,"1undo()",
                                 AutoConnection);
    piVar6 = (int *)CONCAT62(local_d8._2_6_,local_d8.a);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT62(local_d8._2_6_,local_d8.a),2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    if ((QArrayData *)local_198._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_198._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_198._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_198._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_198._0_8_,2,0x10);
      }
    }
    if (bVar7) {
      if (&(local_90.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_a8 != (QArrayData *)0x0) {
        LOCK();
        (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a8,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_b0);
    }
    if (bVar8 != 0) {
      QKeySequence::~QKeySequence(local_70);
    }
    if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
      }
    }
    QTextDocument::isUndoAvailable();
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-undo";
    local_68.a.d.size = 9;
    QObject::doSetObjectName((QString *)pQVar10);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-undo";
    local_68.a.d.size = 9;
    setActionIcon(pQVar10,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    QMetaObject::tr((char *)&local_198,(char *)&staticMetaObject,0x6e714a);
    bVar8 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar8 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_b8,Redo);
      cVar9 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar9 != '\0') goto LAB_004cd143;
      QKeySequence::QKeySequence(local_100,Redo);
      QKeySequence::toString((SequenceFormat)&local_f8);
      local_d8.b.d.size = local_e8;
      local_d8.b.d.ptr = pcStack_f0;
      local_d8.b.d.d = (Data *)local_f8;
      local_d8.a = L'\t';
      local_f8 = (QArrayData *)0x0;
      pcStack_f0 = (char16_t *)0x0;
      local_e8 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_208,&local_d8);
      bVar8 = 1;
      bVar7 = true;
    }
    else {
LAB_004cd143:
      bVar8 = bVar8 ^ 1;
      local_208._0_8_ = (QArrayData *)0x0;
      local_208.b.d.d = (Data *)0x0;
      local_208.b.d.ptr = (char16_t *)0x0;
      bVar7 = false;
    }
    local_68.a.d.size = (qsizetype)local_198.b.d.ptr;
    local_68.a.d.ptr = (char16_t *)local_198.b.d.d;
    local_68.a.d.d = (Data *)local_198._0_8_;
    local_68.b.d.size = (qsizetype)local_208.b.d.ptr;
    local_68.b.d.ptr = (char16_t *)local_208.b.d.d;
    local_68.b.d.d = (Data *)local_208._0_8_;
    local_198._0_8_ = (QArrayData *)0x0;
    local_198.b.d.d = (Data *)0x0;
    local_198.b.d.ptr = (char16_t *)0x0;
    local_208._0_8_ = (QArrayData *)0x0;
    local_208.b.d.d = (Data *)0x0;
    local_208.b.d.ptr = (char16_t *)0x0;
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_128,&local_68);
    pQVar10 = QWidget::addAction(this_00,(QString *)&local_128,(QObject *)this,"1redo()",
                                 AutoConnection);
    if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    if ((QArrayData *)local_208._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._0_8_,2,0x10);
      }
    }
    if (bVar7) {
      if (&(local_d8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_f8 != (QArrayData *)0x0) {
        LOCK();
        (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_f8,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_100);
    }
    if (bVar8 != 0) {
      QKeySequence::~QKeySequence(local_b8);
    }
    if ((QArrayData *)local_198._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_198._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_198._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_198._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_198._0_8_,2,0x10);
      }
    }
    QTextDocument::isRedoAvailable();
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-redo";
    local_68.a.d.size = 9;
    QObject::doSetObjectName((QString *)pQVar10);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-redo";
    local_68.a.d.size = 9;
    setActionIcon(pQVar10,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    QMenu::addSeparator((QMenu *)this_00);
    QMetaObject::tr((char *)&local_208,(char *)&staticMetaObject,0x6e7150);
    bVar8 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar8 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_108,Cut);
      cVar9 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar9 != '\0') goto LAB_004cd47b;
      QKeySequence::QKeySequence(local_150,Cut);
      QKeySequence::toString((SequenceFormat)&local_148);
      local_128.b.d.size = local_138;
      local_128.b.d.ptr = pcStack_140;
      local_128.b.d.d = (Data *)local_148;
      local_128.a = 9;
      local_148 = (QArrayData *)0x0;
      pcStack_140 = (char16_t *)0x0;
      local_138 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_278,&local_128);
      bVar8 = 1;
      bVar7 = true;
    }
    else {
LAB_004cd47b:
      bVar8 = bVar8 ^ 1;
      local_278._0_8_ = (QArrayData *)0x0;
      local_278.b.d.d = (Data *)0x0;
      local_278.b.d.ptr = (char16_t *)0x0;
      bVar7 = false;
    }
    local_68.a.d.size = (qsizetype)local_208.b.d.ptr;
    local_68.a.d.ptr = (char16_t *)local_208.b.d.d;
    local_68.a.d.d = (Data *)local_208._0_8_;
    local_68.b.d.size = (qsizetype)local_278.b.d.ptr;
    local_68.b.d.ptr = (char16_t *)local_278.b.d.d;
    local_68.b.d.d = (Data *)local_278._0_8_;
    local_208._0_8_ = (QArrayData *)0x0;
    local_208.b.d.d = (Data *)0x0;
    local_208.b.d.ptr = (char16_t *)0x0;
    local_278._0_8_ = (QArrayData *)0x0;
    local_278.b.d.d = (Data *)0x0;
    local_278.b.d.ptr = (char16_t *)0x0;
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_198,&local_68);
    pQVar10 = QWidget::addAction(this_00,(QString *)&local_198,(QObject *)this,"1cut()",
                                 AutoConnection);
    if ((QArrayData *)local_198._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_198._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_198._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_198._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_198._0_8_,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    if ((QArrayData *)local_278._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
      }
    }
    if (bVar7) {
      if (&(local_128.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_128.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_128.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_148 != (QArrayData *)0x0) {
        LOCK();
        (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_148,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_150);
    }
    if (bVar8 != 0) {
      QKeySequence::~QKeySequence(local_108);
    }
    if ((QArrayData *)local_208._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._0_8_,2,0x10);
      }
    }
    QTextCursor::hasSelection();
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-cut";
    local_68.a.d.size = 8;
    QObject::doSetObjectName((QString *)pQVar10);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-cut";
    local_68.a.d.size = 8;
    setActionIcon(pQVar10,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((uVar1 & 0x13) != 0) {
    QMetaObject::tr((char *)&local_278,(char *)&staticMetaObject,0x6e7155);
    bVar8 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar8 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_170,Copy);
      cVar9 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar9 != '\0') goto LAB_004cd79f;
      QKeySequence::QKeySequence(local_1c0,Copy);
      QKeySequence::toString((SequenceFormat)&local_1b8);
      local_198.b.d.size = local_1a8;
      local_198.b.d.ptr = pcStack_1b0;
      local_198.b.d.d = (Data *)local_1b8;
      local_198.a = 9;
      local_1b8 = (QArrayData *)0x0;
      pcStack_1b0 = (char16_t *)0x0;
      local_1a8 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>(&local_168,&local_198);
      bVar8 = 1;
      bVar7 = true;
    }
    else {
LAB_004cd79f:
      bVar8 = bVar8 ^ 1;
      local_168.d.d = (Data *)0x0;
      local_168.d.ptr = (char16_t *)0x0;
      local_168.d.size = 0;
      bVar7 = false;
    }
    local_68.b.d.size = local_168.d.size;
    local_68.b.d.ptr = local_168.d.ptr;
    local_68.b.d.d = local_168.d.d;
    local_68.a.d.size = (qsizetype)local_278.b.d.ptr;
    local_68.a.d.ptr = (char16_t *)local_278.b.d.d;
    local_68.a.d.d = (Data *)local_278._0_8_;
    local_278._0_8_ = (QArrayData *)0x0;
    local_278.b.d.d = (Data *)0x0;
    local_278.b.d.ptr = (char16_t *)0x0;
    local_168.d.d = (Data *)0x0;
    local_168.d.ptr = (char16_t *)0x0;
    local_168.d.size = 0;
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_208,&local_68);
    pQVar10 = QWidget::addAction(this_00,(QString *)&local_208,(QObject *)this,"1copy()",
                                 AutoConnection);
    if ((QArrayData *)local_208._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_208._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_208._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_208._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_208._0_8_,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar7) {
      if (&(local_198.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_198.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_198.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_198.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_198.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_1b8 != (QArrayData *)0x0) {
        LOCK();
        (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_1b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_1b8,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_1c0);
    }
    if (bVar8 != 0) {
      QKeySequence::~QKeySequence(local_170);
    }
    if ((QArrayData *)local_278._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
      }
    }
    QTextCursor::hasSelection();
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-copy";
    local_68.a.d.size = 9;
    QObject::doSetObjectName((QString *)pQVar10);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-copy";
    local_68.a.d.size = 9;
    setActionIcon(pQVar10,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((*(byte *)(lVar2 + 0xb0) & 0xc) != 0) {
    QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,0x6f2a36);
    pQVar10 = QWidget::addAction(this_00,&local_68.a,(QObject *)this,"1_q_copyLink()",AutoConnection
                                );
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"link-copy";
    local_68.a.d.size = 9;
    QObject::doSetObjectName((QString *)pQVar10);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((*(byte *)(lVar2 + 0xb0) & 0x10) != 0) {
    QMetaObject::tr((char *)&local_168,(char *)&staticMetaObject,0x6e715b);
    bVar8 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar8 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_1e0,Paste);
      cVar9 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar9 != '\0') goto LAB_004cdbb9;
      QKeySequence::QKeySequence(local_230,Paste);
      QKeySequence::toString((SequenceFormat)&local_228);
      local_208.b.d.size = local_218;
      local_208.b.d.ptr = pcStack_220;
      local_208.b.d.d = (Data *)local_228;
      local_208.a = 9;
      local_228 = (QArrayData *)0x0;
      pcStack_220 = (char16_t *)0x0;
      local_218 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>(&local_1d8,&local_208);
      bVar8 = 1;
      bVar7 = true;
    }
    else {
LAB_004cdbb9:
      bVar8 = bVar8 ^ 1;
      local_1d8.d.d = (Data *)0x0;
      local_1d8.d.ptr = (char16_t *)0x0;
      local_1d8.d.size = 0;
      bVar7 = false;
    }
    local_68.a.d.size = local_168.d.size;
    local_68.a.d.ptr = local_168.d.ptr;
    local_68.a.d.d = local_168.d.d;
    local_68.b.d.size = local_1d8.d.size;
    local_68.b.d.ptr = local_1d8.d.ptr;
    local_68.b.d.d = local_1d8.d.d;
    local_168.d.d = (Data *)0x0;
    local_168.d.ptr = (char16_t *)0x0;
    local_168.d.size = 0;
    local_1d8.d.d = (Data *)0x0;
    local_1d8.d.ptr = (char16_t *)0x0;
    local_1d8.d.size = 0;
    QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_278,&local_68);
    pQVar10 = QWidget::addAction(this_00,(QString *)&local_278,(QObject *)this,"1paste()",
                                 AutoConnection);
    if ((QArrayData *)local_278._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_278._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_278._0_8_,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar7) {
      if (&(local_208.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_208.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_208.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_208.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_208.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_228 != (QArrayData *)0x0) {
        LOCK();
        (local_228->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_228->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_228->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_228,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_230);
    }
    if (bVar8 != 0) {
      QKeySequence::~QKeySequence(local_1e0);
    }
    if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
      }
    }
    canPaste(this);
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-paste";
    local_68.a.d.size = 10;
    QObject::doSetObjectName((QString *)pQVar10);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-paste";
    local_68.a.d.size = 10;
    setActionIcon(pQVar10,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,0x6f4a10);
    pQVar10 = QWidget::addAction(this_00,&local_68.a,(QObject *)this,"1_q_deleteSelected()",
                                 AutoConnection);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    QTextCursor::hasSelection();
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-delete";
    local_68.a.d.size = 0xb;
    QObject::doSetObjectName((QString *)pQVar10);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-delete";
    local_68.a.d.size = 0xb;
    setActionIcon(pQVar10,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((uVar1 & 0x13) != 0) {
    QMenu::addSeparator((QMenu *)this_00);
    QMetaObject::tr((char *)&local_1d8,(char *)&staticMetaObject,0x6ec566);
    bVar8 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    if (bVar8 == 0) {
      pQVar11 = (QKeySequence *)(QGuiApplicationPrivate::self + 0x140);
      QKeySequence::QKeySequence(local_250,SelectAll);
      cVar9 = QShortcutMap::hasShortcutForKeySequence(pQVar11);
      if (cVar9 != '\0') goto LAB_004ce01e;
      QKeySequence::QKeySequence(local_2a0,SelectAll);
      QKeySequence::toString((SequenceFormat)&local_298);
      local_278.b.d.size = local_288;
      local_278.b.d.ptr = pcStack_290;
      local_278.b.d.d = (Data *)local_298;
      local_278.a = 9;
      local_298 = (QArrayData *)0x0;
      pcStack_290 = (char16_t *)0x0;
      local_288 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>(&local_248,&local_278);
      bVar8 = 1;
      bVar7 = true;
    }
    else {
LAB_004ce01e:
      bVar8 = bVar8 ^ 1;
      local_248.d.d = (Data *)0x0;
      local_248.d.ptr = (char16_t *)0x0;
      local_248.d.size = 0;
      bVar7 = false;
    }
    local_68.a.d.size = local_1d8.d.size;
    local_68.a.d.ptr = local_1d8.d.ptr;
    local_68.a.d.d = local_1d8.d.d;
    local_68.b.d.size = local_248.d.size;
    local_68.b.d.ptr = local_248.d.ptr;
    local_68.b.d.d = local_248.d.d;
    local_1d8.d.d = (Data *)0x0;
    local_1d8.d.ptr = (char16_t *)0x0;
    local_1d8.d.size = 0;
    local_248.d.d = (Data *)0x0;
    local_248.d.ptr = (char16_t *)0x0;
    local_248.d.size = 0;
    QStringBuilder<QString,_QString>::convertTo<QString>(&local_168,&local_68);
    pQVar10 = QWidget::addAction(this_00,&local_168,(QObject *)this,"1selectAll()",AutoConnection);
    if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_68);
    if (&(local_248.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_248.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar7) {
      if (&(local_278.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_278.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_278.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_278.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_278.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_298 != (QArrayData *)0x0) {
        LOCK();
        (local_298->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_298->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_298->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_298,2,0x10);
        }
      }
      QKeySequence::~QKeySequence(local_2a0);
    }
    if (bVar8 != 0) {
      QKeySequence::~QKeySequence(local_250);
    }
    if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QTextDocument::isEmpty();
    QAction::setEnabled(SUB81(pQVar10,0));
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"select-all";
    local_68.a.d.size = 10;
    QObject::doSetObjectName((QString *)pQVar10);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_68.a.d.d = (Data *)0x0;
    local_68.a.d.ptr = L"edit-select-all";
    local_68.a.d.size = 0xf;
    setActionIcon(pQVar10,&local_68.a);
    if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((*(byte *)(lVar2 + 0xb0) & 0x10) != 0) {
    QGuiApplication::styleHints();
    cVar9 = QStyleHints::useRtlExtensions();
    if (cVar9 != '\0') {
      QMenu::addSeparator((QMenu *)this_00);
      this_01 = (QUnicodeControlCharacterMenu *)operator_new(0x30);
      QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu(this_01,(QObject *)this,this_00);
      QMenu::addMenu((QMenu *)this_00,(QMenu *)this_01);
    }
  }
LAB_004ce314:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QMenu *)this_00;
}

Assistant:

QMenu *QWidgetTextControl::createStandardContextMenu(const QPointF &pos, QWidget *parent)
{
    Q_D(QWidgetTextControl);

    const bool showTextSelectionActions = d->interactionFlags & (Qt::TextEditable | Qt::TextSelectableByKeyboard | Qt::TextSelectableByMouse);

    d->linkToCopy = QString();
    if (!pos.isNull())
        d->linkToCopy = anchorAt(pos);

    if (d->linkToCopy.isEmpty() && !showTextSelectionActions)
        return nullptr;

    QMenu *menu = new QMenu(parent);
    QAction *a;

    if (d->interactionFlags & Qt::TextEditable) {
        a = menu->addAction(tr("&Undo") + ACCEL_KEY(QKeySequence::Undo), this, SLOT(undo()));
        a->setEnabled(d->doc->isUndoAvailable());
        a->setObjectName(QStringLiteral("edit-undo"));
        setActionIcon(a, QStringLiteral("edit-undo"));
        a = menu->addAction(tr("&Redo") + ACCEL_KEY(QKeySequence::Redo), this, SLOT(redo()));
        a->setEnabled(d->doc->isRedoAvailable());
        a->setObjectName(QStringLiteral("edit-redo"));
        setActionIcon(a, QStringLiteral("edit-redo"));
        menu->addSeparator();

#ifndef QT_NO_CLIPBOARD
        a = menu->addAction(tr("Cu&t") + ACCEL_KEY(QKeySequence::Cut), this, SLOT(cut()));
        a->setEnabled(d->cursor.hasSelection());
        a->setObjectName(QStringLiteral("edit-cut"));
        setActionIcon(a, QStringLiteral("edit-cut"));
#endif
    }

#ifndef QT_NO_CLIPBOARD
    if (showTextSelectionActions) {
        a = menu->addAction(tr("&Copy") + ACCEL_KEY(QKeySequence::Copy), this, SLOT(copy()));
        a->setEnabled(d->cursor.hasSelection());
        a->setObjectName(QStringLiteral("edit-copy"));
        setActionIcon(a, QStringLiteral("edit-copy"));
    }

    if ((d->interactionFlags & Qt::LinksAccessibleByKeyboard)
            || (d->interactionFlags & Qt::LinksAccessibleByMouse)) {

        a = menu->addAction(tr("Copy &Link Location"), this, SLOT(_q_copyLink()));
        a->setEnabled(!d->linkToCopy.isEmpty());
        a->setObjectName(QStringLiteral("link-copy"));
    }
#endif // QT_NO_CLIPBOARD

    if (d->interactionFlags & Qt::TextEditable) {
#ifndef QT_NO_CLIPBOARD
        a = menu->addAction(tr("&Paste") + ACCEL_KEY(QKeySequence::Paste), this, SLOT(paste()));
        a->setEnabled(canPaste());
        a->setObjectName(QStringLiteral("edit-paste"));
        setActionIcon(a, QStringLiteral("edit-paste"));
#endif
        a = menu->addAction(tr("Delete"), this, SLOT(_q_deleteSelected()));
        a->setEnabled(d->cursor.hasSelection());
        a->setObjectName(QStringLiteral("edit-delete"));
        setActionIcon(a, QStringLiteral("edit-delete"));
    }


    if (showTextSelectionActions) {
        menu->addSeparator();
        a = menu->addAction(tr("Select All") + ACCEL_KEY(QKeySequence::SelectAll), this, SLOT(selectAll()));
        a->setEnabled(!d->doc->isEmpty());
        a->setObjectName(QStringLiteral("select-all"));
        setActionIcon(a, QStringLiteral("edit-select-all"));
    }

    if ((d->interactionFlags & Qt::TextEditable) && QGuiApplication::styleHints()->useRtlExtensions()) {
        menu->addSeparator();
        QUnicodeControlCharacterMenu *ctrlCharacterMenu = new QUnicodeControlCharacterMenu(this, menu);
        menu->addMenu(ctrlCharacterMenu);
    }

    return menu;
}